

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

_Bool obj_has_flag(object *obj,wchar_t flag)

{
  curse_data *pcVar1;
  _Bool _Var2;
  angband_constants *paVar3;
  ulong uVar4;
  long lVar5;
  _Bool _Var6;
  
  pcVar1 = obj->curses;
  _Var2 = flag_has_dbg(obj->flags,5,flag,"obj->flags","flag");
  _Var6 = true;
  if (!_Var2) {
    if (pcVar1 == (curse_data *)0x0) {
      _Var6 = false;
    }
    else {
      uVar4 = 1;
      lVar5 = 10;
      paVar3 = z_info;
      while ((_Var6 = uVar4 < paVar3->curse_max, _Var6 &&
             ((pcVar1[uVar4].power == L'\0' ||
              (_Var2 = flag_has_dbg((bitflag *)
                                    (*(long *)(curses->conflict_flags + lVar5 * 8 + -0x28) + 0x4c),5
                                    ,flag,"curses[i].obj->flags","flag"), paVar3 = z_info, !_Var2)))
             )) {
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 7;
      }
    }
  }
  return _Var6;
}

Assistant:

bool obj_has_flag(const struct object *obj, int flag)
{
	struct curse_data *c = obj->curses;

	/* Check the object's own flags */
	if (of_has(obj->flags, flag)) {
		return true;
	}

	/* Check any curse object flags */
	if (c) {
		int i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power && of_has(curses[i].obj->flags, flag)) {
				return true;
			}
		}
	}
	return false;
}